

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

MessageHandle<perfetto::protos::pbzero::TracePacket>
perfetto::internal::TrackEventInternal::NewTracePacket
          (TraceWriterBase *trace_writer,TrackEventIncrementalState *incr_state,
          TrackEventTlsState *tls_state,TraceTimestamp timestamp,uint32_t seq_flags)

{
  ulong uVar1;
  ulong uVar2;
  ulong value;
  BuiltinClock BVar3;
  TracePacket *pTVar4;
  long lVar5;
  BuiltinClock value_00;
  undefined4 in_register_0000008c;
  uint32_t in_stack_00000008;
  bool local_5d;
  uint64_t time_diff_ns;
  uint64_t ts_unit_multiplier;
  TrackEventTlsState *tls_state_local;
  TrackEventIncrementalState *incr_state_local;
  TraceWriterBase *trace_writer_local;
  TraceTimestamp timestamp_local;
  MessageHandle<perfetto::protos::pbzero::TracePacket> *packet;
  
  lVar5 = timestamp._0_8_;
  trace_writer_local._0_4_ = (uint32_t)timestamp.value;
  value = CONCAT44(in_register_0000008c,seq_flags);
  local_5d = *(int *)(lVar5 + 0x10) != 0x40 && (uint32_t)trace_writer_local == 0x40;
  if (local_5d) {
    trace_writer_local._0_4_ = *(uint32_t *)(lVar5 + 0x10);
  }
  (**(code **)(*(long *)incr_state + 0x10))(trace_writer);
  uVar1 = *(ulong *)(lVar5 + 8);
  if ((uint32_t)trace_writer_local == 0x40) {
    uVar2._0_1_ = tls_state[0x21].enable_thread_time_sampling;
    uVar2._1_1_ = tls_state[0x21].filter_debug_annotations;
    uVar2._2_1_ = tls_state[0x21].filter_dynamic_event_names;
    uVar2._3_5_ = *(undefined5 *)&tls_state[0x21].field_0x3;
    if (value < uVar2) {
      pTVar4 = protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::operator->
                         ((MessageHandle<perfetto::protos::pbzero::TracePacket> *)trace_writer);
      protos::pbzero::TracePacket::set_timestamp(pTVar4,value / uVar1);
      pTVar4 = protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::operator->
                         ((MessageHandle<perfetto::protos::pbzero::TracePacket> *)trace_writer);
      BVar3 = GetClockId();
      value_00 = 0x41;
      if (uVar1 == 1) {
        value_00 = BVar3;
      }
      protos::pbzero::TracePacket::set_timestamp_clock_id(pTVar4,value_00);
    }
    else {
      lVar5 = *(long *)(tls_state + 0x21);
      pTVar4 = protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::operator->
                         ((MessageHandle<perfetto::protos::pbzero::TracePacket> *)trace_writer);
      protos::pbzero::TracePacket::set_timestamp(pTVar4,(value - lVar5) / uVar1);
      tls_state[0x21].enable_thread_time_sampling = (bool)(char)seq_flags;
      tls_state[0x21].filter_debug_annotations = (bool)(char)(seq_flags >> 8);
      tls_state[0x21].filter_dynamic_event_names = (bool)(char)(seq_flags >> 0x10);
      *(int5 *)&tls_state[0x21].field_0x3 = (int5)(value >> 0x18);
    }
  }
  else if ((uint32_t)trace_writer_local == *(uint32_t *)(lVar5 + 0x10)) {
    pTVar4 = protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::operator->
                       ((MessageHandle<perfetto::protos::pbzero::TracePacket> *)trace_writer);
    protos::pbzero::TracePacket::set_timestamp(pTVar4,value / uVar1);
  }
  else {
    pTVar4 = protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::operator->
                       ((MessageHandle<perfetto::protos::pbzero::TracePacket> *)trace_writer);
    protos::pbzero::TracePacket::set_timestamp(pTVar4,value);
    pTVar4 = protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::operator->
                       ((MessageHandle<perfetto::protos::pbzero::TracePacket> *)trace_writer);
    protos::pbzero::TracePacket::set_timestamp_clock_id(pTVar4,(uint32_t)trace_writer_local);
  }
  pTVar4 = protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::operator->
                     ((MessageHandle<perfetto::protos::pbzero::TracePacket> *)trace_writer);
  protos::pbzero::TracePacket::set_sequence_flags(pTVar4,in_stack_00000008);
  return (MessageHandle<perfetto::protos::pbzero::TracePacket>)(MessageHandleBase)trace_writer;
}

Assistant:

protozero::MessageHandle<protos::pbzero::TracePacket>
TrackEventInternal::NewTracePacket(TraceWriterBase* trace_writer,
                                   TrackEventIncrementalState* incr_state,
                                   const TrackEventTlsState& tls_state,
                                   TraceTimestamp timestamp,
                                   uint32_t seq_flags) {
  if (PERFETTO_UNLIKELY(tls_state.default_clock != kClockIdIncremental &&
                        timestamp.clock_id == kClockIdIncremental)) {
    timestamp.clock_id = tls_state.default_clock;
  }
  auto packet = trace_writer->NewTracePacket();
  auto ts_unit_multiplier = tls_state.timestamp_unit_multiplier;
  if (PERFETTO_LIKELY(timestamp.clock_id == kClockIdIncremental)) {
    if (PERFETTO_LIKELY(incr_state->last_timestamp_ns <= timestamp.value)) {
      // No need to set the clock id here, since kClockIdIncremental is the
      // clock id assumed by default.
      auto time_diff_ns = timestamp.value - incr_state->last_timestamp_ns;
      packet->set_timestamp(time_diff_ns / ts_unit_multiplier);
      incr_state->last_timestamp_ns = timestamp.value;
    } else {
      packet->set_timestamp(timestamp.value / ts_unit_multiplier);
      packet->set_timestamp_clock_id(ts_unit_multiplier == 1
                                         ? static_cast<uint32_t>(GetClockId())
                                         : kClockIdAbsolute);
    }
  } else if (PERFETTO_LIKELY(timestamp.clock_id == tls_state.default_clock)) {
    packet->set_timestamp(timestamp.value / ts_unit_multiplier);
  } else {
    packet->set_timestamp(timestamp.value);
    packet->set_timestamp_clock_id(timestamp.clock_id);
  }
  packet->set_sequence_flags(seq_flags);
  return packet;
}